

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.hpp
# Opt level: O1

void __thiscall
kdtree::
KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
::KDTree(KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
         *this,vector<int_*,_std::allocator<int_*>_> *values)

{
  pointer ppiVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  Node *pNVar5;
  int d;
  long lVar6;
  
  piVar3 = (int *)operator_new__(0x14);
  this->boundingBoxMin = piVar3;
  piVar4 = (int *)operator_new__(0x14);
  this->boundingBoxMax = piVar4;
  ppiVar1 = (values->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (ppiVar1 ==
      (values->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    pNVar5 = (Node *)0x0;
  }
  else {
    piVar2 = *ppiVar1;
    lVar6 = 0;
    do {
      piVar3[lVar6] = piVar2[lVar6];
      piVar4[lVar6] = piVar2[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 5);
    pNVar5 = buildKDTree(this,values,0);
  }
  this->root = pNVar5;
  return;
}

Assistant:

KDTree(std::vector<T*> values) {
			if (values.empty()) {
				root = nullptr;
			}
			else {
				for (int d = 0; d < dim; d++) {
					SET()(boundingBoxMin, values[0], d);
					SET()(boundingBoxMax, values[0], d);
				}
				root = buildKDTree(values);
			}
		}